

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.hpp
# Opt level: O3

ssize_t __thiscall
ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>
::read(adaptor<true> *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  piVar1 = *__buf;
  if (piVar1 == (int *)plVar4[2]) {
    __assert_fail("it != end_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/chunk.hpp"
                  ,0x8c,
                  "<dependent type> ranges::chunk_view_<ranges::ref_view<std::vector<int>>, true>::adaptor<true>::read(const iterator_t<CRng> &) const [Rng = ranges::ref_view<std::vector<int>>, IsForwardRange = true, Const = true]"
                 );
  }
  lVar2 = *plVar4;
  if ((-1 < lVar2) && (lVar3 = plVar4[1], lVar2 < lVar3)) {
    if (lVar2 == 0) {
      this->n_ = (range_difference_t<CRng>)plVar4[2];
      (this->end_)._M_current = piVar1;
      this[1].super_box<long,_void,_(ranges::detail::box_compress)0>.value = lVar3;
      return (ssize_t)this;
    }
    __assert_fail("0 == offset()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/chunk.hpp"
                  ,0x8d,
                  "<dependent type> ranges::chunk_view_<ranges::ref_view<std::vector<int>>, true>::adaptor<true>::read(const iterator_t<CRng> &) const [Rng = ranges::ref_view<std::vector<int>>, IsForwardRange = true, Const = true]"
                 );
  }
  __assert_fail("0 <= result && result < n_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/chunk.hpp"
                ,0x71,
                "const offset_t<Const> &ranges::chunk_view_<ranges::ref_view<std::vector<int>>, true>::adaptor<true>::offset() const [Rng = ranges::ref_view<std::vector<int>>, IsForwardRange = true, Const = true]"
               );
}

Assistant:

constexpr auto read(iterator_t<CRng> const & it) const
                -> decltype(views::take(make_subrange(it, end_), n_))
            {
                RANGES_EXPECT(it != end_);
                RANGES_EXPECT(0 == offset());
                return views::take(make_subrange(it, end_), n_);
            }